

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void __thiscall helics::Federate::setAsyncCheck(Federate *this,function<bool_()> *asyncCheck)

{
  shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *in_RSI;
  long in_RDI;
  handle asyncInfo;
  function<bool_()> *in_stack_ffffffffffffffe8;
  shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *this_00;
  
  if ((*(byte *)(in_RDI + 0xe) & 1) == 0) {
    this_00 = in_RSI;
    std::
    unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
    ::operator->((unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
                  *)0x310412);
    gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>::lock(in_RSI);
    gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::operator->
              ((lock_handle<helics::AsyncFedCallInfo,_std::mutex> *)&stack0xffffffffffffffd8);
    std::function<bool_()>::operator=((function<bool_()> *)this_00,in_stack_ffffffffffffffe8);
    gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::~lock_handle
              ((lock_handle<helics::AsyncFedCallInfo,_std::mutex> *)0x310446);
  }
  return;
}

Assistant:

void Federate::setAsyncCheck(std::function<bool()> asyncCheck)
{
    if (singleThreadFederate) {
        return;
    }
    auto asyncInfo = asyncCallInfo->lock();
    asyncInfo->asyncCheck = std::move(asyncCheck);
}